

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel1.cpp
# Opt level: O2

int256_t * __thiscall
primesum::pi_lmo_parallel1(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int threads)

{
  uint64_t sieve_limit;
  double dVar1;
  double dVar2;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined1 x_06 [16];
  int256_t res;
  ulong uVar3;
  pointer piVar4;
  int iVar5;
  __int128 *p_Var6;
  int64_t iVar7;
  long lVar8;
  long lVar9;
  pointer this_00;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int in_ECX;
  ulong uVar13;
  uint uVar14;
  undefined4 in_register_00000014;
  primesum *this_01;
  pointer this_02;
  uint64_t low;
  ulong extraout_RDX;
  int i;
  primesum *ppVar15;
  int iVar16;
  uint64_t uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint64_t c;
  uint64_t uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  int64_t m;
  unsigned___int128 *puVar27;
  size_t size;
  size_type __new_size;
  uint64_t low_00;
  unsigned___int128 *puVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  value_type local_358;
  uint local_334;
  pointer local_330;
  ulong local_328;
  unsigned___int128 *local_320;
  primesum *local_318;
  long local_310;
  BitSieve sieve;
  ulong local_2e0;
  ulong local_2d0;
  int64_t segments_per_thread;
  uint64_t local_2c0;
  long local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  uint64_t local_290;
  ulong local_288;
  uint64_t local_280;
  ulong local_278;
  int64_t segment_size;
  int256_t s2;
  vector<int,_std::allocator<int>_> primes;
  int256_t phi;
  vector<int,_std::allocator<int>_> mu;
  aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_> phi_1;
  vector<int,_std::allocator<int>_> pi;
  aligned_vector<double> timings;
  aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_> mu_sum;
  vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> phi_total;
  Wheel wheel;
  vector<int,_std::allocator<int>_> lpf;
  int256_t s1;
  int256_t p2;
  
  this_01 = (primesum *)CONCAT44(in_register_00000014,threads);
  if (-(long)this_01 < (long)(ulong)((primesum *)0x1 < this)) {
    auVar32._8_8_ = in_stack_fffffffffffffc80;
    auVar32._0_8_ = in_stack_fffffffffffffc78;
    dVar1 = get_alpha_lmo(this,(int128_t)auVar32);
    x_00._8_8_ = in_stack_fffffffffffffc80;
    x_00._0_8_ = in_stack_fffffffffffffc78;
    p_Var6 = iroot<3,__int128>((__int128 *)this,this_01,(__int128)x_00);
    puVar27 = (unsigned___int128 *)(long)((double)(long)p_Var6 * dVar1);
    local_298 = (long)puVar27 >> 0x3f;
    local_318 = this;
    iVar7 = __divti3(this,this_01,puVar27);
    if ((long)puVar27 < 0xd) {
      c = (uint64_t)*(int *)(PhiTiny::pi + (long)puVar27 * 4);
    }
    else {
      c = 6;
    }
    local_320 = puVar27;
    std::__cxx11::string::string<std::allocator<char>>((string *)&phi,"",(allocator<char> *)&sieve);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"=== pi_lmo_parallel1(x) ===",(allocator<char> *)&sieve);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"pi(x) = S1 + S2 + pi(y) - 1 - P2",(allocator<char> *)&sieve);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    ppVar15 = local_318;
    puVar27 = local_320;
    x_01._8_8_ = in_stack_fffffffffffffc80;
    x_01._0_8_ = in_stack_fffffffffffffc78;
    print(local_318,(int128_t)x_01,(int64_t)this_01,(int64_t)local_320,iVar7,dVar1,(int)c);
    x_02._8_8_ = in_stack_fffffffffffffc80;
    x_02._0_8_ = in_stack_fffffffffffffc78;
    P2(&p2,ppVar15,(int128_t)x_02,(int64_t)this_01,(int)puVar27);
    generate_moebius(&mu,(int64_t)puVar27);
    generate_lpf(&lpf,(int64_t)puVar27);
    generate_primes(&primes,(int64_t)puVar27);
    x_03._8_8_ = in_stack_fffffffffffffc80;
    x_03._0_8_ = in_stack_fffffffffffffc78;
    S1(&s1,local_318,(int128_t)x_03,(int64_t)this_01,(int64_t)puVar27,(int)c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&phi,"",(allocator<char> *)&sieve);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"=== S2(x, y) ===",(allocator<char> *)&sieve);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"Computation of the special leaves",(allocator<char> *)&sieve);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    ppVar15 = local_318;
    lVar8 = __udivti3(local_318,this_01,puVar27,local_298);
    sieve_limit = lVar8 + 1;
    s2.low._0_8_ = 0;
    s2.low._8_8_ = 0;
    s2.high._0_8_ = 0;
    s2.high._8_8_ = 0;
    local_334 = ideal_num_threads(in_ECX,sieve_limit,100000);
    x_04._8_8_ = in_stack_fffffffffffffc80;
    x_04._0_8_ = in_stack_fffffffffffffc78;
    S2LoadBalancer::S2LoadBalancer
              ((S2LoadBalancer *)&phi,(int128_t)x_04,(int64_t)ppVar15,(int64_t)this_01,
               (int64_t)puVar27);
    segment_size = S2LoadBalancer::get_min_segment_size((S2LoadBalancer *)&phi);
    segments_per_thread = 1;
    dVar1 = get_time();
    generate_pi(&pi,(int64_t)puVar27);
    sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sieve.size_ = 0;
    sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::vector
              (&phi_total,
               (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type *)&sieve,
               (allocator_type *)&local_358);
    lVar12 = c + 1;
    local_2a0 = 0;
    local_2a8 = 0;
    local_2b0 = 0;
    local_2b8 = 0;
    lVar20 = 1;
    local_280 = c;
    while( true ) {
      if ((long)sieve_limit <= lVar20) break;
      lVar9 = ((lVar8 - lVar20) + segment_size) / segment_size;
      uVar14 = local_334;
      if (lVar9 < (int)local_334) {
        uVar14 = (uint)lVar9;
      }
      bVar29 = (int)local_334 < 1;
      local_334 = uVar14;
      if (bVar29) {
        local_334 = 1;
      }
      size = (size_t)(int)local_334;
      lVar9 = (long)(lVar9 + size + -1) / (long)size;
      if (segments_per_thread < lVar9) {
        lVar9 = segments_per_thread;
      }
      bVar29 = segments_per_thread < 1;
      segments_per_thread = lVar9;
      if (bVar29) {
        segments_per_thread = 1;
      }
      aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::
      aligned_vector(&phi_1,size);
      aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::
      aligned_vector(&mu_sum,size);
      aligned_vector<double>::aligned_vector(&timings,size);
      uVar13 = 0;
      if (0 < (int)local_334) {
        uVar13 = (ulong)local_334;
      }
      for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
        dVar2 = get_time();
        iVar7 = segment_size;
        timings.vect_.
        super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11].val[0] = dVar2;
        this_02 = mu_sum.vect_.
                  super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar11;
        this_00 = phi_1.vect_.
                  super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar11;
        low = segments_per_thread * segment_size * uVar11 + lVar20;
        local_2c0 = segments_per_thread * segment_size + low;
        if ((long)sieve_limit <= (long)local_2c0) {
          local_2c0 = sieve_limit;
        }
        auVar32 = __udivti3(ppVar15,this_01,low,(long)low >> 0x3f);
        x_05._8_8_ = in_stack_fffffffffffffc80;
        x_05._0_8_ = in_stack_fffffffffffffc78;
        puVar27 = isqrt<unsigned__int128>(auVar32._0_8_,auVar32._8_8_,(unsigned___int128)x_05);
        if (local_298 <= extraout_RDX && (ulong)(puVar27 < local_320) <= extraout_RDX - local_298) {
          puVar27 = local_320;
        }
        __new_size = (long)pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)puVar27] + 1;
        lVar10 = isqrt<long>((long)local_320);
        local_2d0 = 0;
        local_2e0 = 0;
        lVar9 = 0;
        uVar24 = 0;
        if (lVar12 < (long)__new_size) {
          iVar23 = pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar10];
          iVar16 = pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[(long)local_320];
          BitSieve::BitSieve(&sieve,iVar7);
          Wheel::Wheel<std::vector<int,std::allocator<int>>>(&wheel,&primes,__new_size,low);
          local_358.high._0_8_ = 0;
          local_358.high._8_8_ = 0;
          local_358.low._0_8_ = 0;
          local_358.low._8_8_ = 0;
          std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
                    (this_00->val,__new_size,&local_358);
          local_358.high._0_8_ = 0;
          local_358.high._8_8_ = 0;
          local_358.low._0_8_ = 0;
          local_358.low._8_8_ = 0;
          std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
                    (this_02->val,__new_size,&local_358);
          iVar26 = (int)__new_size;
          if (iVar26 < iVar23) {
            iVar23 = iVar26;
          }
          if (iVar26 < iVar16) {
            iVar16 = iVar26;
          }
          local_328 = 0;
          local_310 = 0;
          local_2d0 = 0;
          local_2e0 = 0;
          uVar22 = c;
LAB_0011bb4c:
          low_00 = low;
          c = uVar22;
          if ((long)low_00 < (long)local_2c0) {
            low = iVar7 + low_00;
            uVar17 = low;
            if ((long)local_2c0 < (long)low) {
              uVar17 = local_2c0;
            }
            BitSieve::pre_sieve(&sieve,c,low_00);
            uVar22 = c;
            local_290 = uVar17;
            while (c = c + 1, (long)c < (long)iVar23) {
              uVar24 = (ulong)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[c];
              auVar32 = __udivti3(ppVar15,this_01,local_290 * uVar24,
                                  (long)(local_290 * uVar24) >> 0x3f);
              puVar27 = local_320;
              local_288 = (long)local_320 / (long)uVar24;
              if ((ulong)((long)local_288 >> 0x3f) < auVar32._8_8_ ||
                  ((long)local_288 >> 0x3f) - auVar32._8_8_ < (ulong)(local_288 < auVar32._0_8_)) {
                local_288 = auVar32._0_8_;
              }
              auVar32 = __udivti3(ppVar15,this_01,low_00 * uVar24,(long)(low_00 * uVar24) >> 0x3f);
              puVar28 = auVar32._0_8_;
              if (local_298 <= auVar32._8_8_ &&
                  (ulong)(auVar32._0_8_ < puVar27) <= auVar32._8_8_ - local_298) {
                puVar28 = puVar27;
              }
              uVar22 = local_280;
              if ((long)puVar28 <= (long)uVar24) goto LAB_0011bb4c;
              uVar25 = 0;
              uVar18 = local_288;
              local_330 = (pointer)uVar24;
              for (; (long)uVar18 < (long)puVar28;
                  puVar28 = (unsigned___int128 *)((long)puVar28 + -1)) {
                if ((mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)puVar28] != 0) &&
                   ((int)local_330 <
                    lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)puVar28])) {
                  lVar10 = (long)puVar28 * (long)local_330;
                  lVar9 = __udivti3(ppVar15,this_01,lVar10,lVar10 >> 0x3f);
                  for (; (long)uVar25 <= (long)(lVar9 - low_00); uVar25 = uVar25 + 2) {
                    local_358.low._0_8_ =
                         *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar25 & 0x7f) * 8) &
                         sieve.sieve_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar25 >> 7];
                    if ((ulong)local_358.low != 0) {
                      local_358.low._0_8_ = low_00 + uVar25;
                    }
                    local_358.low._8_8_ = (long)(ulong)local_358.low >> 0x3f;
                    local_358.high._0_8_ = local_358.low._8_8_;
                    local_358.high._8_8_ = local_358.low._8_8_;
                    int256_t::operator+=
                              (this_00->val[0].
                               super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                               ._M_impl.super__Vector_impl_data._M_start + c,&local_358);
                  }
                  int256_t::operator*(&local_358,
                                      this_00->val[0].
                                      super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start + c,
                                      mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[(long)puVar28] * lVar10);
                  uVar21 = local_358.high._8_8_;
                  uVar19 = (ulong)local_358.high;
                  uVar24 = (ulong)local_358.low;
                  local_278 = local_358.low._8_8_;
                  local_358.low._0_8_ =
                       lVar10 * mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[(long)puVar28];
                  local_358.low._8_8_ = (long)(ulong)local_358.low >> 0x3f;
                  local_358.high._0_8_ = local_358.low._8_8_;
                  local_358.high._8_8_ = local_358.low._8_8_;
                  int256_t::operator-=
                            (this_02->val[0].
                             super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                             ._M_impl.super__Vector_impl_data._M_start + c,&local_358);
                  bVar29 = local_328 < uVar19;
                  uVar19 = local_328 - uVar19;
                  bVar30 = local_2d0 < uVar24;
                  local_2d0 = local_2d0 - uVar24;
                  uVar24 = (ulong)bVar30;
                  bVar30 = local_2e0 < local_278;
                  uVar18 = local_2e0 - local_278;
                  local_2e0 = uVar18 - uVar24;
                  uVar24 = (ulong)(bVar30 || uVar18 < uVar24);
                  local_328 = uVar19 - uVar24;
                  local_310 = ((local_310 - uVar21) - (ulong)bVar29) - (ulong)(uVar19 < uVar24);
                  ppVar15 = local_318;
                  uVar18 = local_288;
                  uVar22 = local_280;
                }
              }
              for (; (long)uVar25 < (long)(uVar17 - low_00); uVar25 = uVar25 + 2) {
                local_358.low._0_8_ =
                     *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar25 & 0x7f) * 8) &
                     sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar25 >> 7];
                if ((ulong)local_358.low != 0) {
                  local_358.low._0_8_ = low_00 + uVar25;
                }
                local_358.low._8_8_ = (long)(ulong)local_358.low >> 0x3f;
                local_358.high._0_8_ = local_358.low._8_8_;
                local_358.high._8_8_ = local_358.low._8_8_;
                int256_t::operator+=
                          (this_00->val[0].
                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                           ._M_impl.super__Vector_impl_data._M_start + c,&local_358);
              }
              anon_unknown.dwarf_dc463::cross_off
                        (&sieve,low_00,local_290,(int64_t)local_330,
                         wheel.wheel_.
                         super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                         ._M_impl.super__Vector_impl_data._M_start + c);
            }
            for (; (long)c < (long)iVar16; c = c + 1) {
              local_330 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              iVar26 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[c];
              uVar24 = (ulong)iVar26;
              auVar32 = __udivti3(ppVar15,this_01,low_00 * uVar24,(long)(low_00 * uVar24) >> 0x3f);
              puVar27 = local_320;
              puVar28 = auVar32._0_8_;
              if (local_298 <= auVar32._8_8_ &&
                  (ulong)(auVar32._0_8_ < local_320) <= auVar32._8_8_ - local_298) {
                puVar28 = local_320;
              }
              uVar18 = (ulong)pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)puVar28];
              auVar32 = __udivti3(ppVar15,this_01,local_290 * uVar24,
                                  (long)(local_290 * uVar24) >> 0x3f);
              local_288 = (long)puVar27 / (long)uVar24;
              if ((long)puVar27 / (long)uVar24 <= (long)uVar24) {
                local_288 = uVar24;
              }
              if ((ulong)((long)local_288 >> 0x3f) < auVar32._8_8_ ||
                  ((long)local_288 >> 0x3f) - auVar32._8_8_ < (ulong)(local_288 < auVar32._0_8_)) {
                local_288 = auVar32._0_8_;
              }
              iVar5 = local_330[uVar18];
              ppVar15 = local_318;
              local_330 = (pointer)uVar24;
              local_278 = uVar18;
              if (iVar5 <= iVar26) break;
              uVar24 = 0;
              while (ppVar15 = local_318, (long)local_288 < (long)iVar5) {
                lVar9 = (long)iVar5 * (long)local_330;
                lVar9 = __udivti3(local_318,this_01,lVar9,lVar9 >> 0x3f);
                for (; uVar18 = local_278, piVar4 = local_330,
                    (long)uVar24 <= (long)(lVar9 - low_00); uVar24 = uVar24 + 2) {
                  local_358.low._0_8_ =
                       *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar24 & 0x7f) * 8) &
                       sieve.sieve_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar24 >> 7];
                  if ((ulong)local_358.low != 0) {
                    local_358.low._0_8_ = low_00 + uVar24;
                  }
                  local_358.low._8_8_ = (long)(ulong)local_358.low >> 0x3f;
                  local_358.high._0_8_ = local_358.low._8_8_;
                  local_358.high._8_8_ = local_358.low._8_8_;
                  int256_t::operator+=
                            (this_00->val[0].
                             super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                             ._M_impl.super__Vector_impl_data._M_start + c,&local_358);
                }
                int256_t::operator*(&local_358,
                                    this_00->val[0].
                                    super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start + c,
                                    (long)primes.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start[local_278] *
                                    (long)local_330);
                uVar3 = local_358.high._8_8_;
                uVar21 = (ulong)local_358.high;
                uVar19 = local_358.low._8_8_;
                uVar25 = (ulong)local_358.low;
                local_358.low._0_8_ =
                     (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar18] * (long)piVar4;
                local_358.low._8_8_ = (long)(ulong)local_358.low >> 0x3f;
                local_358.high._0_8_ = local_358.low._8_8_;
                local_358.high._8_8_ = local_358.low._8_8_;
                int256_t::operator+=
                          (this_02->val[0].
                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                           ._M_impl.super__Vector_impl_data._M_start + c,&local_358);
                bVar29 = CARRY8(uVar21,local_328);
                uVar21 = uVar21 + local_328;
                bVar30 = CARRY8(local_2d0,uVar25);
                local_2d0 = local_2d0 + uVar25;
                uVar25 = (ulong)bVar30;
                bVar30 = CARRY8(local_2e0,uVar19);
                uVar19 = local_2e0 + uVar19;
                local_2e0 = uVar19 + uVar25;
                uVar25 = (ulong)(bVar30 || CARRY8(uVar19,uVar25));
                local_328 = uVar21 + uVar25;
                local_310 = uVar3 + local_310 + (ulong)bVar29 + (ulong)CARRY8(uVar21,uVar25);
                local_278 = uVar18 - 1;
                uVar22 = local_280;
                iVar5 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar18 - 1];
              }
              for (; (long)uVar24 < (long)(uVar17 - low_00); uVar24 = uVar24 + 2) {
                local_358.low._0_8_ =
                     *(ulong *)(BitSieve::set_bit_ + (ulong)((uint)uVar24 & 0x7f) * 8) &
                     sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar24 >> 7];
                if ((ulong)local_358.low != 0) {
                  local_358.low._0_8_ = low_00 + uVar24;
                }
                local_358.low._8_8_ = (long)(ulong)local_358.low >> 0x3f;
                local_358.high._0_8_ = local_358.low._8_8_;
                local_358.high._8_8_ = local_358.low._8_8_;
                int256_t::operator+=
                          (this_00->val[0].
                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                           ._M_impl.super__Vector_impl_data._M_start + c,&local_358);
              }
              anon_unknown.dwarf_dc463::cross_off
                        (&sieve,low_00,local_290,(int64_t)local_330,
                         wheel.wheel_.
                         super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                         ._M_impl.super__Vector_impl_data._M_start + c);
            }
            goto LAB_0011bb4c;
          }
          std::_Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>::
          ~_Vector_base((_Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
                        &wheel);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&sieve);
          lVar9 = local_310;
          uVar24 = local_328;
        }
        bVar29 = CARRY8(local_2b0,uVar24);
        uVar24 = local_2b0 + uVar24;
        bVar30 = CARRY8(local_2a0,local_2d0);
        local_2a0 = local_2a0 + local_2d0;
        bVar31 = CARRY8(local_2a8,local_2e0);
        local_2e0 = local_2a8 + local_2e0;
        local_2a8 = local_2e0 + bVar30;
        uVar18 = (ulong)(bVar31 || CARRY8(local_2e0,(ulong)bVar30));
        local_2b0 = uVar24 + uVar18;
        local_2b8 = local_2b8 + lVar9 + (ulong)bVar29 + (ulong)CARRY8(uVar24,uVar18);
        s2.low._0_8_ = local_2a0;
        s2.low._8_8_ = local_2a8;
        s2.high._0_8_ = local_2b0;
        s2.high._8_8_ = local_2b8;
        dVar2 = get_time();
        timings.vect_.
        super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11].val[0] =
             dVar2 - timings.vect_.
                     super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11].val[0];
        puVar27 = local_320;
      }
      for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
        lVar9 = 0x20;
        for (uVar24 = 1;
            uVar24 < (ulong)((long)phi_1.vect_.
                                   super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar11].val[0].
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)phi_1.vect_.
                                   super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar11].val[0].
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar24 = uVar24 + 1) {
          int256_t::operator*((int256_t *)&sieve,
                              (int256_t *)
                              ((long)&(mu_sum.vect_.
                                       super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar11].val[0].
                                       super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->low + lVar9),
                              (int256_t *)
                              ((long)&(phi_total.
                                       super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->low + lVar9));
          bVar29 = CARRY8(local_2b0,
                          (ulong)sieve.sieve_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar25 = local_2b0 +
                   (long)sieve.sieve_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          bVar30 = CARRY8(local_2a0,
                          (ulong)sieve.sieve_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
          local_2a0 = local_2a0 +
                      (long)sieve.sieve_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          bVar31 = CARRY8(local_2a8,
                          (ulong)sieve.sieve_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
          uVar18 = local_2a8 +
                   (long)sieve.sieve_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          local_2a8 = uVar18 + bVar30;
          uVar18 = (ulong)(bVar31 || CARRY8(uVar18,(ulong)bVar30));
          local_2b0 = uVar25 + uVar18;
          local_2b8 = local_2b8 + sieve.size_ + (ulong)bVar29 + (ulong)CARRY8(uVar25,uVar18);
          s2.low._0_8_ = local_2a0;
          s2.low._8_8_ = local_2a8;
          s2.high._0_8_ = local_2b0;
          s2.high._8_8_ = local_2b8;
          int256_t::operator+=
                    ((int256_t *)
                     ((long)&(phi_total.
                              super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->low + lVar9),
                     (int256_t *)
                     ((long)&(phi_1.vect_.
                              super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].val[0].
                              super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->low + lVar9));
          lVar9 = lVar9 + 0x20;
        }
        puVar27 = local_320;
      }
      lVar20 = lVar20 + segments_per_thread * size * segment_size;
      S2LoadBalancer::update
                ((S2LoadBalancer *)&phi,lVar20,size,&segment_size,&segments_per_thread,&timings);
      std::
      _Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
      ::~_Vector_base((_Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                       *)&timings);
      std::
      vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
      ::~vector(&mu_sum.vect_);
      std::
      vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
      ::~vector(&phi_1.vect_);
      ppVar15 = local_318;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sieve,"S2",(allocator<char> *)&local_358);
    res.low._8_8_ = s2.low._8_8_;
    res.low._0_8_ = (ulong)s2.low;
    res.high._0_8_ = (ulong)s2.high;
    res.high._8_8_ = s2.high._8_8_;
    uVar13 = (ulong)s2.low;
    uVar11 = s2.low._8_8_;
    print((string *)&sieve,res,dVar1);
    std::__cxx11::string::~string((string *)&sieve);
    std::_Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>::~_Vector_base
              (&phi_total.
                super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&pi.super__Vector_base<int,_std::allocator<int>_>);
    phi.high._0_8_ = (ulong)s2.high + (ulong)s1.high;
    phi.high._8_8_ = s2.high._8_8_ + s1.high._8_8_ + (ulong)CARRY8((ulong)s2.high,(ulong)s1.high);
    phi.low._0_8_ = (ulong)s2.low + (ulong)s1.low;
    phi.low._8_8_ = s2.low._8_8_ + s1.low._8_8_ + (ulong)CARRY8((ulong)s2.low,(ulong)s1.low);
    if (CARRY8(s2.low._8_8_,s1.low._8_8_) ||
        CARRY8(s2.low._8_8_ + s1.low._8_8_,(ulong)CARRY8((ulong)s2.low,(ulong)s1.low))) {
      bVar29 = 0xfffffffffffffffe < (ulong)phi.high;
      phi.high._0_8_ = (ulong)phi.high + 1;
      phi.high._8_8_ = phi.high._8_8_ + (ulong)bVar29;
    }
    prime_sum_tiny((int128_t *)puVar27,phi.low._8_8_);
    x_06._8_8_ = uVar11;
    x_06._0_8_ = uVar13;
    int256_t::operator+(&local_358,&phi,(__int128)x_06);
    int256_t::operator-((int256_t *)&sieve,&local_358,1);
    lVar12 = (long)sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)(pointer)p2.high;
    lVar20 = (sieve.size_ - p2.high._8_8_) -
             (ulong)(sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)p2.high);
    *(long *)((long)&__return_storage_ptr__->high + 8) = lVar20;
    *(long *)&__return_storage_ptr__->high = lVar12;
    *(long *)&__return_storage_ptr__->low =
         (long)sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start - (long)(pointer)p2.low;
    *(ulong *)((long)&__return_storage_ptr__->low + 8) =
         ((long)sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)p2.low._8_8_) -
         (ulong)(sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start < (pointer)p2.low);
    if (sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish < p2.low._8_8_ ||
        (ulong)((long)sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)p2.low._8_8_) <
        (ulong)(sieve.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start < (pointer)p2.low)) {
      *(long *)&__return_storage_ptr__->high = lVar12 + -1;
      *(ulong *)((long)&__return_storage_ptr__->high + 8) = lVar20 + -1 + (ulong)(lVar12 != 0);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&primes.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&lpf.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&mu.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_lmo_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, c, primes, lpf, mu, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}